

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

uint32_t av1_get_crc32c_value_c(void *c,uint8_t *buf,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  CRC32C *p;
  uint64_t crc;
  uint8_t *next;
  size_t len_local;
  uint8_t *buf_local;
  void *c_local;
  
  crc = 0xffffffff;
  next = buf;
  for (len_local = len; len_local != 0 && ((ulong)next & 7) != 0; len_local = len_local - 1) {
    crc = (ulong)*(uint *)((long)c + ((crc ^ *next) & 0xff) * 4) ^ crc >> 8;
    next = next + 1;
  }
  for (; 7 < len_local; len_local = len_local - 8) {
    uVar1 = *(ulong *)next;
    uVar2 = uVar1 ^ crc;
    crc = (uint64_t)
          (*(uint *)((long)c + (uVar2 & 0xff) * 4 + 0x1c00) ^
           *(uint *)((long)c + (uVar2 >> 8 & 0xff) * 4 + 0x1800) ^
           *(uint *)((long)c + (uVar2 >> 0x10 & 0xff) * 4 + 0x1400) ^
           *(uint *)((long)c + (uVar2 >> 0x18 & 0xff) * 4 + 0x1000) ^
           *(uint *)((long)c + (uVar1 >> 0x20 & 0xff) * 4 + 0xc00) ^
           *(uint *)((long)c + (uVar1 >> 0x28 & 0xff) * 4 + 0x800) ^
           *(uint *)((long)c + (uVar1 >> 0x30 & 0xff) * 4 + 0x400) ^
          *(uint *)((long)c + (uVar1 >> 0x38) * 4));
    next = next + 8;
  }
  for (; len_local != 0; len_local = len_local - 1) {
    crc = (ulong)*(uint *)((long)c + ((crc ^ *next) & 0xff) * 4) ^ crc >> 8;
    next = next + 1;
  }
  return (uint)crc ^ 0xffffffff;
}

Assistant:

uint32_t av1_get_crc32c_value_c(void *c, uint8_t *buf, size_t len) {
  const uint8_t *next = (const uint8_t *)(buf);
  uint64_t crc;
  CRC32C *p = (CRC32C *)c;
  crc = 0 ^ 0xffffffff;
  while (len && ((uintptr_t)next & 7) != 0) {
    crc = p->table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
    len--;
  }
  while (len >= 8) {
    crc ^= *(uint64_t *)next;
    crc = p->table[7][crc & 0xff] ^ p->table[6][(crc >> 8) & 0xff] ^
          p->table[5][(crc >> 16) & 0xff] ^ p->table[4][(crc >> 24) & 0xff] ^
          p->table[3][(crc >> 32) & 0xff] ^ p->table[2][(crc >> 40) & 0xff] ^
          p->table[1][(crc >> 48) & 0xff] ^ p->table[0][crc >> 56];
    next += 8;
    len -= 8;
  }
  while (len) {
    crc = p->table[0][(crc ^ *next++) & 0xff] ^ (crc >> 8);
    len--;
  }
  return (uint32_t)crc ^ 0xffffffff;
}